

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,TextureCubeView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  int i;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int y;
  int faceSize;
  bool bVar8;
  int z;
  int lodOffsNdx;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Vector<float,_4> res_2;
  Vec2 lodBounds;
  Vector<float,_4> res_4;
  Vector<bool,_4> res_6;
  Vec3 coordDxo;
  Vec4 refPix;
  Vec3 coordDyo;
  Vec4 resPix;
  Vec3 triW [2];
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vec2 lodO;
  Vec2 clampedLod;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Vec2 lodBias;
  Vec2 lodOffsets [8];
  TextureCubeView src;
  undefined1 local_2f8 [36];
  float local_2d4;
  float local_2d0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  float local_2c0 [2];
  undefined1 local_2b8 [36];
  float local_294;
  ulong local_290;
  ConstPixelBufferAccess *local_288;
  Vec3 local_280;
  float local_270;
  float local_26c;
  float local_268;
  float local_264;
  float local_260;
  float local_25c;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  float local_208 [5];
  Vec3 local_1f4;
  Vec4 local_1e8;
  float local_1d8 [4];
  float local_1c8;
  float local_1c4;
  float local_1b8 [4];
  float local_1a8;
  float local_1a4;
  float local_198 [4];
  float local_188;
  float local_184;
  float local_178 [4];
  float local_168;
  float local_164;
  PixelBufferAccess *local_158;
  float local_14c;
  float local_148;
  float local_144;
  float local_140;
  float local_13c;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_138;
  ConstPixelBufferAccess *local_118;
  ReferenceParams *local_110;
  Sampler *local_108;
  ulong local_100;
  ulong local_f8;
  float afStack_f0 [2];
  undefined1 local_e8 [16];
  float local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [4];
  float fStack_a4;
  ConstPixelBufferAccess *pCStack_a0;
  ConstPixelBufferAccess *local_98;
  ConstPixelBufferAccess *pCStack_90;
  ConstPixelBufferAccess *local_88;
  ConstPixelBufferAccess *pCStack_80;
  ConstPixelBufferAccess *local_78;
  undefined1 *puStack_70;
  TextureCubeView local_68;
  
  local_138.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158 = errorMask;
  local_118 = reference;
  getSubView((TextureCubeView *)local_a8,baseView,sampleParams->baseLevel,sampleParams->maxLevel);
  local_108 = &sampleParams->sampler;
  tcu::getEffectiveTextureView(&local_68,(TextureCubeView *)local_a8,&local_138,local_108);
  local_178[0] = *texCoord;
  local_198[0] = texCoord[1];
  local_178[1] = texCoord[3];
  local_178[2] = texCoord[6];
  local_178[3] = texCoord[9];
  local_198[1] = texCoord[4];
  local_198[2] = texCoord[7];
  local_198[3] = texCoord[10];
  local_1b8[0] = texCoord[2];
  local_1b8[1] = texCoord[5];
  local_1b8[2] = texCoord[8];
  local_1b8[3] = texCoord[0xb];
  if (local_68.m_numLevels < 1) {
    faceSize = 0;
  }
  else {
    faceSize = (local_68.m_levels[0]->m_size).m_data[0];
  }
  fVar16 = (float)(result->m_size).m_data[0];
  fVar17 = (float)(result->m_size).m_data[1];
  local_1d8[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_1d8[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_1d8[2] = (sampleParams->super_RenderParams).w.m_data[2];
  local_1d8[3] = (sampleParams->super_RenderParams).w.m_data[3];
  fVar9 = 0.0;
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    fVar9 = (sampleParams->super_RenderParams).bias;
  }
  lVar5 = 0;
  do {
    afStack_f0[lVar5] = fVar9;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  local_a8 = (undefined1  [4])0xbf800000;
  fStack_a4 = 0.0;
  pCStack_a0 = (ConstPixelBufferAccess *)0x3f800000;
  local_98 = (ConstPixelBufferAccess *)0xbf80000000000000;
  pCStack_90 = (ConstPixelBufferAccess *)0x3f80000000000000;
  local_88 = (ConstPixelBufferAccess *)0xbf800000bf800000;
  pCStack_80 = (ConstPixelBufferAccess *)0x3f800000bf800000;
  local_78 = (ConstPixelBufferAccess *)0xbf8000003f800000;
  puStack_70 = &DAT_3f8000003f800000;
  local_208[0] = -1.7146522e+38;
  local_1c8 = local_1d8[2];
  local_1c4 = local_1d8[1];
  local_1a8 = local_1b8[2];
  local_1a4 = local_1b8[1];
  local_188 = local_198[2];
  local_184 = local_198[1];
  local_168 = local_178[2];
  local_164 = local_178[1];
  tcu::RGBA::toVec((RGBA *)&local_1e8);
  tcu::clear(local_158,&local_1e8);
  if ((result->m_size).m_data[1] < 1) {
    local_290 = 0;
  }
  else {
    local_290 = 0;
    z = 0;
    local_288 = result;
    local_110 = sampleParams;
    do {
      if (watchDog != (qpWatchDog *)0x0) {
        qpWatchDog_touch(watchDog);
      }
      if (0 < (local_288->m_size).m_data[0]) {
        local_2f8._24_4_ = (float)z + 0.5;
        local_258 = (float)local_2f8._24_4_ / fVar17;
        local_26c = ((float)local_2f8._24_4_ + -0.0625) / fVar17;
        local_270 = ((float)local_2f8._24_4_ + 0.0625) / fVar17;
        local_264 = fVar17 - (float)local_2f8._24_4_;
        local_268 = 1.0 - local_258;
        y = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_2f8,(int)local_288,y,z);
          local_208[0] = 0.0;
          local_208[1] = 0.0;
          local_208[2] = 0.0;
          local_208[3] = 0.0;
          lVar5 = 0;
          do {
            local_208[lVar5] =
                 *(float *)(local_2f8 + lVar5 * 4) -
                 (sampleParams->super_RenderParams).colorBias.m_data[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          local_1e8.m_data[0] = 0.0;
          local_1e8.m_data[1] = 0.0;
          local_1e8.m_data[2] = 0.0;
          local_1e8.m_data[3] = 0.0;
          lVar5 = 0;
          do {
            local_1e8.m_data[lVar5] =
                 local_208[lVar5] / (sampleParams->super_RenderParams).colorScale.m_data[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_2b8,(int)local_118,y,z);
          local_2f8._0_4_ = R;
          local_2f8._4_4_ = SNORM_INT8;
          local_2f8._8_4_ = 0;
          local_2f8._12_4_ = 0;
          lVar5 = 0;
          do {
            *(float *)(local_2f8 + lVar5 * 4) =
                 *(float *)(local_2b8 + lVar5 * 4) -
                 (sampleParams->super_RenderParams).colorBias.m_data[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          local_208[0] = 0.0;
          local_208[1] = 0.0;
          local_208[2] = 0.0;
          local_208[3] = 0.0;
          lVar5 = 0;
          do {
            local_208[lVar5] =
                 *(float *)(local_2f8 + lVar5 * 4) /
                 (sampleParams->super_RenderParams).colorScale.m_data[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          local_2b8._0_4_ = R;
          local_2b8._4_4_ = SNORM_INT8;
          local_2b8._8_4_ = 0;
          local_2b8._12_4_ = 0;
          lVar5 = 0;
          do {
            *(float *)(local_2b8 + lVar5 * 4) = local_1e8.m_data[lVar5] - local_208[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          local_2f8._0_4_ = R;
          local_2f8._4_4_ = SNORM_INT8;
          local_2f8._8_4_ = 0;
          local_2f8._12_4_ = 0;
          lVar5 = 0;
          do {
            fVar9 = *(float *)(local_2b8 + lVar5 * 4);
            fVar10 = -fVar9;
            if (-fVar9 <= fVar9) {
              fVar10 = fVar9;
            }
            *(float *)(local_2f8 + lVar5 * 4) = fVar10;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          local_2b8._28_4_ = 0.0;
          lVar5 = 0;
          do {
            local_2b8[lVar5 + 0x1c] =
                 *(float *)(local_2f8 + lVar5 * 4) <= (lookupPrec->colorThreshold).m_data[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          if (local_2b8[0x1c] == '\0') {
LAB_018fecdd:
            fVar10 = (float)y + 0.5;
            fVar9 = (fVar10 + -0.0625) / fVar16 + local_26c;
            fVar11 = (fVar10 + 0.0625) / fVar16 + local_270;
            if ((fVar9 <= 1.0) || (1.0 <= fVar11)) {
              local_254 = fVar10 / fVar16;
              local_100 = (ulong)(1.0 <= fVar11);
              uVar7 = (ulong)(1.0 < fVar9);
              local_25c = fVar16 - fVar10;
              local_260 = 1.0 - local_254;
              bVar8 = false;
              do {
                local_2f8._28_4_ = local_2f8._24_4_;
                fVar9 = local_258;
                fVar11 = local_254;
                local_2f8._32_4_ = fVar10;
                if (uVar7 != 0) {
                  local_2f8._32_4_ = local_25c;
                  local_2f8._28_4_ = local_264;
                  fVar9 = local_268;
                  fVar11 = local_260;
                }
                local_f8 = uVar7;
                fVar1 = local_178[uVar7 * 3];
                local_20c = local_178[uVar7 * 3 + 1];
                fVar12 = (1.0 - fVar11) - fVar9;
                fVar13 = local_1d8[uVar7 * 3];
                local_e8 = ZEXT416((uint)fVar13);
                local_210 = local_1d8[uVar7 * 3 + 1];
                local_2c4 = local_178[uVar7 * 3 + 2];
                local_214 = local_1d8[uVar7 * 3 + 2];
                fVar15 = fVar11 / local_214 + fVar9 / local_210 + fVar12 / fVar13;
                fVar2 = local_198[uVar7 * 3];
                local_2c8 = local_198[uVar7 * 3 + 1];
                local_2cc = local_198[uVar7 * 3 + 2];
                local_2d0 = local_1b8[uVar7 * 3];
                fVar3 = local_1b8[uVar7 * 3 + 1];
                local_2d4 = local_1b8[uVar7 * 3 + 2];
                local_2f8._4_4_ =
                     ((fVar11 * local_2cc) / local_214 +
                     (fVar9 * local_2c8) / local_210 + (fVar12 * fVar2) / fVar13) / fVar15;
                local_2f8._0_4_ =
                     ((fVar11 * local_2c4) / local_214 +
                     (fVar9 * local_20c) / local_210 + (fVar12 * fVar1) / fVar13) / fVar15;
                local_2f8._8_4_ =
                     ((fVar11 * local_2d4) / local_214 +
                     (fVar9 * fVar3) / local_210 + (fVar12 * local_2d0) / fVar13) / fVar15;
                local_218 = local_214 * fVar16;
                local_21c = local_210 * local_214;
                fVar15 = fVar9 + -1.0;
                fVar14 = (fVar16 * fVar15 + fVar10) * local_21c -
                         (local_218 * fVar9 + fVar10 * local_210) * fVar13;
                local_220 = (local_20c - fVar1) * local_214 + (local_2c4 - local_20c) * fVar13;
                local_224 = (fVar1 - local_2c4) * local_210;
                local_228 = (local_2c8 - fVar2) * local_214 + (local_2cc - local_2c8) * fVar13;
                local_22c = (fVar2 - local_2cc) * local_210;
                local_230 = (fVar3 - local_2d0) * local_214 + (local_2d4 - fVar3) * fVar13;
                local_234 = (local_2d0 - local_2d4) * local_210;
                fVar18 = fVar13 * local_210 * local_214;
                fVar12 = fVar18 * fVar16;
                fVar14 = fVar14 * fVar14;
                local_c8 = ZEXT416((uint)fVar12);
                local_2b8._4_4_ = ((local_22c * fVar15 + fVar9 * local_228) * fVar12) / fVar14;
                local_2b8._0_4_ = ((local_224 * fVar15 + fVar9 * local_220) * fVar12) / fVar14;
                local_2b8._8_4_ = ((fVar15 * local_234 + fVar9 * local_230) * fVar12) / fVar14;
                local_238 = local_210 * fVar17;
                fVar9 = fVar11 + -1.0;
                local_294 = (fVar17 * fVar9 + (float)local_2f8._24_4_) * local_21c -
                            (local_238 * fVar11 + (float)local_2f8._24_4_ * local_214) * fVar13;
                local_23c = (local_20c - local_2c4) * fVar13 + (local_2c4 - fVar1) * local_210;
                local_240 = (fVar1 - local_20c) * local_214;
                local_244 = (local_2c8 - local_2cc) * fVar13 + (local_2cc - fVar2) * local_210;
                local_248 = (fVar2 - local_2c8) * local_214;
                local_24c = (fVar3 - local_2d4) * fVar13 + (local_2d4 - local_2d0) * local_210;
                local_250 = (local_2d0 - fVar3) * local_214;
                fVar18 = fVar18 * fVar17;
                local_294 = local_294 * local_294;
                local_2b8._28_4_ = ((local_240 * fVar9 + fVar11 * local_23c) * fVar18) / local_294;
                local_2b8._32_4_ = ((local_248 * fVar9 + fVar11 * local_244) * fVar18) / local_294;
                local_b8 = ZEXT416((uint)fVar18);
                local_294 = ((fVar9 * local_250 + fVar11 * local_24c) * fVar18) / local_294;
                tcu::computeCubeLodBoundsFromDerivates
                          ((tcu *)local_2c0,(Vec3 *)local_2f8,(Vec3 *)local_2b8,
                           (Vec3 *)(local_2b8 + 0x1c),faceSize,lodPrec);
                local_d8 = -(float)local_e8._0_4_;
                uStack_d4 = local_e8._4_4_ ^ 0x80000000;
                uStack_d0 = local_e8._8_4_ ^ 0x80000000;
                uStack_cc = local_e8._12_4_ ^ 0x80000000;
                lVar5 = 0;
                do {
                  fVar12 = *(float *)(local_a8 + lVar5 * 8) + (float)local_2f8._32_4_;
                  fVar11 = *(float *)(local_a8 + lVar5 * 8 + 4) + (float)local_2f8._28_4_;
                  fVar9 = fVar12 / fVar16;
                  fVar13 = fVar11 / fVar17;
                  fVar15 = (1.0 - fVar9) - fVar13;
                  local_13c = fVar9 / local_214 +
                              fVar13 / local_210 + fVar15 / (float)local_e8._0_4_;
                  local_144 = ((local_2c4 * fVar9) / local_214 +
                              (local_20c * fVar13) / local_210 +
                              (fVar1 * fVar15) / (float)local_e8._0_4_) / local_13c;
                  local_140 = ((local_2cc * fVar9) / local_214 +
                              (local_2c8 * fVar13) / local_210 +
                              (fVar2 * fVar15) / (float)local_e8._0_4_) / local_13c;
                  local_13c = ((local_2d4 * fVar9) / local_214 +
                              (fVar3 * fVar13) / local_210 +
                              (fVar15 * local_2d0) / (float)local_e8._0_4_) / local_13c;
                  fVar15 = fVar13 + -1.0;
                  fVar12 = (fVar16 * fVar15 + fVar12) * local_21c +
                           (local_218 * fVar13 + fVar12 * local_210) * local_d8;
                  fVar12 = fVar12 * fVar12;
                  local_280.m_data[2] =
                       ((fVar15 * local_234 + fVar13 * local_230) * (float)local_c8._0_4_) / fVar12;
                  local_280.m_data[1] =
                       ((local_22c * fVar15 + local_228 * fVar13) * (float)local_c8._0_4_) / fVar12;
                  local_280.m_data[0] =
                       ((local_224 * fVar15 + local_220 * fVar13) * (float)local_c8._0_4_) / fVar12;
                  fVar13 = fVar9 + -1.0;
                  fVar11 = (fVar17 * fVar13 + fVar11) * local_21c +
                           (local_238 * fVar9 + fVar11 * local_214) * local_d8;
                  fVar11 = fVar11 * fVar11;
                  local_1f4.m_data[2] =
                       ((fVar13 * local_250 + fVar9 * local_24c) * (float)local_b8._0_4_) / fVar11;
                  local_1f4.m_data[1] =
                       ((local_248 * fVar13 + local_244 * fVar9) * (float)local_b8._0_4_) / fVar11;
                  local_1f4.m_data[0] =
                       ((local_240 * fVar13 + local_23c * fVar9) * (float)local_b8._0_4_) / fVar11;
                  tcu::computeCubeLodBoundsFromDerivates
                            ((tcu *)&local_14c,(Vec3 *)&local_144,&local_280,&local_1f4,faceSize,
                             lodPrec);
                  sampleParams = local_110;
                  local_2c0[0] = (float)(~-(uint)(local_2c0[0] <= local_14c) & (uint)local_14c |
                                        (uint)local_2c0[0] & -(uint)(local_2c0[0] <= local_14c));
                  local_2c0[1] = (float)(~-(uint)(local_148 <= local_2c0[1]) & (uint)local_148 |
                                        (uint)local_2c0[1] & -(uint)(local_148 <= local_2c0[1]));
                  lVar5 = lVar5 + 1;
                } while (lVar5 != 8);
                local_280.m_data[0] = 0.0;
                local_280.m_data[1] = 0.0;
                lVar5 = 0;
                do {
                  local_280.m_data[lVar5] = local_2c0[lVar5] + afStack_f0[lVar5];
                  lVar5 = lVar5 + 1;
                } while (lVar5 == 1);
                local_1f4.m_data[0] = local_110->minLod;
                local_1f4.m_data[1] = local_110->maxLod;
                tcu::clampLodBounds((tcu *)&local_144,(Vec2 *)&local_280,(Vec2 *)&local_1f4,lodPrec)
                ;
                bVar4 = tcu::isLookupResultValid
                                  (&local_68,local_108,lookupPrec,(Vec3 *)local_2f8,
                                   (Vec2 *)&local_144,&local_1e8);
                if (bVar4) {
                  bVar8 = true;
                }
                uVar7 = local_f8 + 1;
              } while (local_f8 < local_100 && !bVar4);
              if (bVar8) goto LAB_018ff7cd;
            }
            local_2b8._0_4_ = 0xff0000ff;
            tcu::RGBA::toVec((RGBA *)local_2f8);
            tcu::PixelBufferAccess::setPixel(local_158,(Vec4 *)local_2f8,y,z,0);
            local_290 = (ulong)((int)local_290 + 1);
          }
          else {
            uVar7 = 0;
            do {
              uVar6 = uVar7;
              if (uVar6 == 3) break;
              uVar7 = uVar6 + 1;
            } while (local_2b8[uVar6 + 0x1d] != '\0');
            if (uVar6 < 3) goto LAB_018fecdd;
          }
LAB_018ff7cd:
          y = y + 1;
        } while (y < (local_288->m_size).m_data[0]);
      }
      z = z + 1;
    } while (z < (local_288->m_size).m_data[1]);
  }
  if (local_138.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (int)local_290;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::TextureCubeView&			baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::TextureCubeView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const int									srcSize				= src.getSize();

	// Coordinates per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	const float									posEps				= 1.0f / float(1<<MIN_SUBPIXEL_BITS);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),

		// \note Not strictly allowed by spec, but implementations do this in practice.
		tcu::Vec2(-1, -1),
		tcu::Vec2(-1, +1),
		tcu::Vec2(+1, -1),
		tcu::Vec2(+1, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const bool		tri0	= (wx-posEps)/dstW + (wy-posEps)/dstH <= 1.0f;
				const bool		tri1	= (wx+posEps)/dstW + (wy+posEps)/dstH >= 1.0f;

				bool			isOk	= false;

				DE_ASSERT(tri0 || tri1);

				// Pixel can belong to either of the triangles if it lies close enough to the edge.
				for (int triNdx = (tri0?0:1); triNdx <= (tri1?1:0); triNdx++)
				{
					const float		triWx	= triNdx ? dstW - wx : wx;
					const float		triWy	= triNdx ? dstH - wy : wy;
					const float		triNx	= triNdx ? 1.0f - nx : nx;
					const float		triNy	= triNdx ? 1.0f - ny : ny;

					const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
					const tcu::Vec3	coordDx		(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy));
					const tcu::Vec3	coordDy		(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx));

					tcu::Vec2		lodBounds	= tcu::computeCubeLodBoundsFromDerivates(coord, coordDx, coordDy, srcSize, lodPrec);

					// Compute lod bounds across lodOffsets range.
					for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
					{
						const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
						const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
						const float		nxo		= wxo/dstW;
						const float		nyo		= wyo/dstH;

						const tcu::Vec3	coordO		(projectedTriInterpolate(triS[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triT[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triR[triNdx], triW[triNdx], nxo, nyo));
						const tcu::Vec3	coordDxo	(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo));
						const tcu::Vec3	coordDyo	(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo));
						const tcu::Vec2	lodO		= tcu::computeCubeLodBoundsFromDerivates(coordO, coordDxo, coordDyo, srcSize, lodPrec);

						lodBounds.x() = de::min(lodBounds.x(), lodO.x());
						lodBounds.y() = de::max(lodBounds.y(), lodO.y());
					}

					const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);

					if (tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix))
					{
						isOk = true;
						break;
					}
				}

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}